

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  undefined1 *puVar1;
  basic_format_specs<char> *pbVar2;
  byte bVar3;
  error_handler eVar4;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
  *in_RAX;
  error_handler *peVar5;
  type tVar6;
  uint uVar7;
  error_handler *peVar8;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin == end) {
    return begin;
  }
  local_18.handler = in_RAX;
  peVar5 = (error_handler *)
           parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                     (begin,end,handler);
  if (peVar5 == (error_handler *)end) {
    return (char *)peVar5;
  }
  eVar4 = *peVar5;
  if (eVar4 == (error_handler)0x20) {
    tVar6 = (handler->checker_).arg_type_;
    uVar7 = tVar6 - int_type;
    if (10 < uVar7) goto LAB_00208a09;
    bVar3 = 0x30;
LAB_002088bd:
    if ((uVar7 < 8) && ((char_type < tVar6 || ((0x10aU >> (tVar6 & 0x1f) & 1) == 0)))) {
      error_handler::on_error(peVar5,"format specifier requires signed argument");
    }
    pbVar2 = (handler->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    pbVar2->field_0x9 = pbVar2->field_0x9 & 0x8f | bVar3;
    peVar5 = peVar5 + 1;
  }
  else {
    if (eVar4 == (error_handler)0x2d) {
      tVar6 = (handler->checker_).arg_type_;
      uVar7 = tVar6 - int_type;
      if (10 < uVar7) goto LAB_00208a09;
      bVar3 = 0x10;
      goto LAB_002088bd;
    }
    if (eVar4 == (error_handler)0x2b) {
      tVar6 = (handler->checker_).arg_type_;
      uVar7 = tVar6 - int_type;
      if (10 < uVar7) goto LAB_00208a09;
      bVar3 = 0x20;
      goto LAB_002088bd;
    }
  }
  if (peVar5 == (error_handler *)end) {
    return (char *)peVar5;
  }
  eVar4 = *peVar5;
  if (eVar4 == (error_handler)0x23) {
    if (10 < (handler->checker_).arg_type_ - int_type) goto LAB_00208a09;
    puVar1 = &((handler->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_)->field_0x9;
    *puVar1 = *puVar1 | 0x80;
    peVar5 = peVar5 + 1;
    if (peVar5 == (error_handler *)end) {
      return (char *)peVar5;
    }
    eVar4 = *peVar5;
  }
  if (eVar4 == (error_handler)0x30) {
    if (10 < (handler->checker_).arg_type_ - int_type) {
LAB_00208a09:
      error_handler::on_error(peVar5,"format specifier requires numeric argument");
    }
    pbVar2 = (handler->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    pbVar2->field_0x9 = pbVar2->field_0x9 & 0xf0 | 4;
    (((handler->
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->fill).data_[0] = '0';
    peVar5 = peVar5 + 1;
    if (peVar5 == (error_handler *)end) {
      return (char *)peVar5;
    }
    eVar4 = *peVar5;
  }
  if ((byte)((char)eVar4 - 0x30U) < 10) {
    uVar7 = 0;
    peVar8 = peVar5;
    do {
      peVar8 = peVar8 + 1;
      peVar5 = peVar8;
      if (0xccccccc < uVar7) goto LAB_002089fd;
      uVar7 = ((uint)(byte)eVar4 + uVar7 * 10) - 0x30;
      peVar5 = (error_handler *)end;
    } while ((peVar8 != (error_handler *)end) &&
            (eVar4 = *peVar8, peVar5 = peVar8, (byte)((char)eVar4 - 0x30U) < 10));
    if ((int)uVar7 < 0) {
LAB_002089fd:
      error_handler::on_error(peVar5,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->width = uVar7;
  }
  else {
    if (eVar4 != (error_handler)0x7b) goto LAB_002089cb;
    peVar5 = peVar5 + 1;
    if (peVar5 != (error_handler *)end) {
      local_18.handler = handler;
      peVar5 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&,char>>
                         ((char *)peVar5,end,&local_18);
    }
    if ((peVar5 == (error_handler *)end) || (*peVar5 != (error_handler)0x7d)) {
      error_handler::on_error(peVar5,"invalid format string");
    }
    peVar5 = peVar5 + 1;
  }
  if (peVar5 == (error_handler *)end) {
    return (char *)peVar5;
  }
LAB_002089cb:
  if (*peVar5 == (error_handler)0x2e) {
    peVar5 = (error_handler *)
             parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                       ((char *)peVar5,end,handler);
  }
  if ((peVar5 != (error_handler *)end) && (eVar4 = *peVar5, eVar4 != (error_handler)0x7d)) {
    peVar5 = peVar5 + 1;
    ((handler->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->type = (char)eVar4;
  }
  return (char *)peVar5;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end) return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (to_ascii(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}